

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void cmLGInfoProp(cmMakefile *mf,cmGeneratorTarget *target,string *prop)

{
  string_view value;
  cmValue name;
  bool bVar1;
  string *this;
  cmValue local_28;
  cmValue val;
  string *prop_local;
  cmGeneratorTarget *target_local;
  cmMakefile *mf_local;
  
  val.Value = prop;
  local_28 = cmGeneratorTarget::GetProperty(target,prop);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  name = val;
  if (bVar1) {
    this = cmValue::operator*[abi_cxx11_(&local_28);
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    cmMakefile::AddDefinition(mf,name.Value,value);
  }
  return;
}

Assistant:

static void cmLGInfoProp(cmMakefile* mf, cmGeneratorTarget* target,
                         const std::string& prop)
{
  if (cmValue val = target->GetProperty(prop)) {
    mf->AddDefinition(prop, *val);
  }
}